

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O3

char wabt::anon_unknown_0::CWriter::MangleType(Type type)

{
  uint uVar1;
  
  if (0xffffffee < (uint)type.enum_) {
    uVar1 = type.enum_ + 0x11;
    if ((0x1f003U >> (uVar1 & 0x1f) & 1) != 0) {
      return "eriiiiiiiiiiodfji"[(int)uVar1];
    }
  }
  abort();
}

Assistant:

constexpr char CWriter::MangleType(Type type) {
  // clang-format off
  switch (type) {
    case Type::I32: return 'i';
    case Type::I64: return 'j';
    case Type::F32: return 'f';
    case Type::F64: return 'd';
    case Type::V128: return 'o';
    case Type::FuncRef: return 'r';
    case Type::ExternRef: return 'e';
    default:
      WABT_UNREACHABLE;
  }
  // clang-format on
}